

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  uint uVar1;
  Lit LVar2;
  bool bVar3;
  int iVar4;
  Size SVar5;
  CRef CVar6;
  vec<Minisat::Solver::Watcher,_int> *this_00;
  Watcher *cr;
  Lit *pLVar7;
  Clause *pCVar8;
  VarData *cr_00;
  uint *puVar9;
  int local_48;
  int local_44;
  int j;
  int i;
  int local_38;
  Var v_1;
  int i_1;
  int j_1;
  vec<Minisat::Solver::Watcher,_int> *ws;
  int local_20;
  Lit p;
  int s;
  int v;
  ClauseAllocator *to_local;
  Solver *this_local;
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::cleanAll(&this->watches);
  for (p.x = 0; LVar2.x = p.x, iVar4 = nVars(this), LVar2.x < iVar4; p.x = p.x + 1) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      ws._4_4_ = mkLit(p.x,local_20 != 0);
      this_00 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                ::operator[](&this->watches,(Lit *)((long)&ws + 4));
      for (v_1 = 0; SVar5 = vec<Minisat::Solver::Watcher,_int>::size(this_00), v_1 < SVar5;
          v_1 = v_1 + 1) {
        cr = vec<Minisat::Solver::Watcher,_int>::operator[](this_00,v_1);
        ClauseAllocator::reloc(&this->ca,&cr->cref,to);
      }
    }
  }
  local_38 = 0;
  do {
    SVar5 = vec<Minisat::Lit,_int>::size(&this->trail);
    if (SVar5 <= local_38) {
      local_48 = 0;
      for (local_44 = 0; SVar5 = vec<unsigned_int,_int>::size(&this->learnts), local_44 < SVar5;
          local_44 = local_44 + 1) {
        puVar9 = vec<unsigned_int,_int>::operator[](&this->learnts,local_44);
        bVar3 = isRemoved(this,*puVar9);
        if (!bVar3) {
          puVar9 = vec<unsigned_int,_int>::operator[](&this->learnts,local_44);
          ClauseAllocator::reloc(&this->ca,puVar9,to);
          puVar9 = vec<unsigned_int,_int>::operator[](&this->learnts,local_44);
          uVar1 = *puVar9;
          puVar9 = vec<unsigned_int,_int>::operator[](&this->learnts,local_48);
          *puVar9 = uVar1;
          local_48 = local_48 + 1;
        }
      }
      vec<unsigned_int,_int>::shrink(&this->learnts,local_44 - local_48);
      local_48 = 0;
      for (local_44 = 0; SVar5 = vec<unsigned_int,_int>::size(&this->clauses), local_44 < SVar5;
          local_44 = local_44 + 1) {
        puVar9 = vec<unsigned_int,_int>::operator[](&this->clauses,local_44);
        bVar3 = isRemoved(this,*puVar9);
        if (!bVar3) {
          puVar9 = vec<unsigned_int,_int>::operator[](&this->clauses,local_44);
          ClauseAllocator::reloc(&this->ca,puVar9,to);
          puVar9 = vec<unsigned_int,_int>::operator[](&this->clauses,local_44);
          uVar1 = *puVar9;
          puVar9 = vec<unsigned_int,_int>::operator[](&this->clauses,local_48);
          *puVar9 = uVar1;
          local_48 = local_48 + 1;
        }
      }
      vec<unsigned_int,_int>::shrink(&this->clauses,local_44 - local_48);
      return;
    }
    pLVar7 = vec<Minisat::Lit,_int>::operator[](&this->trail,local_38);
    iVar4 = var((Lit)pLVar7->x);
    CVar6 = reason(this,iVar4);
    if (CVar6 != 0xffffffff) {
      CVar6 = reason(this,iVar4);
      pCVar8 = ClauseAllocator::operator[](&this->ca,CVar6);
      bVar3 = Clause::reloced(pCVar8);
      if (!bVar3) {
        CVar6 = reason(this,iVar4);
        pCVar8 = ClauseAllocator::operator[](&this->ca,CVar6);
        bVar3 = locked(this,pCVar8);
        if (!bVar3) goto LAB_00111f47;
      }
      CVar6 = reason(this,iVar4);
      bVar3 = isRemoved(this,CVar6);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        __assert_fail("!isRemoved(reason(v))",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                      ,0x405,"void Minisat::Solver::relocAll(ClauseAllocator &)");
      }
      cr_00 = IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>::operator[]
                        (&(this->vardata).
                          super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>
                         ,iVar4);
      ClauseAllocator::reloc(&this->ca,&cr_00->reason,to);
    }
LAB_00111f47:
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    // All watchers:
    //
    watches.cleanAll();
    for (int v = 0; v < nVars(); v++)
        for (int s = 0; s < 2; s++){
            Lit p = mkLit(v, s);
            vec<Watcher>& ws = watches[p];
            for (int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
        }

    // All reasons:
    //
    for (int i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        // Note: it is not safe to call 'locked()' on a relocated clause. This is why we keep
        // 'dangling' reasons here. It is safe and does not hurt.
        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)]))){
            assert(!isRemoved(reason(v)));
            ca.reloc(vardata[v].reason, to);
        }
    }

    // All learnt:
    //
    int i, j;
    for (i = j = 0; i < learnts.size(); i++)
        if (!isRemoved(learnts[i])){
            ca.reloc(learnts[i], to);
            learnts[j++] = learnts[i];
        }
    learnts.shrink(i - j);

    // All original:
    //
    for (i = j = 0; i < clauses.size(); i++)
        if (!isRemoved(clauses[i])){
            ca.reloc(clauses[i], to);
            clauses[j++] = clauses[i];
        }
    clauses.shrink(i - j);
}